

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O2

bool __thiscall
cppcms::session_interface::validate_csrf_token(session_interface *this,string *token)

{
  __type _Var1;
  string session_token;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,"_csrf",&local_71);
  std::__cxx11::string::string((string *)&local_70,"",&local_72);
  get(&local_30,this,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (local_30._M_string_length == 0) {
    _Var1 = true;
  }
  else {
    _Var1 = std::operator==(&local_30,token);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return _Var1;
}

Assistant:

bool session_interface::validate_csrf_token(std::string const &token)
{
	std::string session_token = get("_csrf","");
	return session_token.empty() || session_token == token;
}